

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

bool __thiscall QProcessPrivate::openChannelsForDetached(QProcessPrivate *this)

{
  bool bVar1;
  ProcessChannelType PVar2;
  long in_FS_OFFSET;
  int local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  QObject **local_18;
  
  local_18 = *(QObject ***)(in_FS_OFFSET + 0x28);
  PVar2 = (this->stdinChannel).type;
  if (PVar2 == Normal) {
LAB_0041c103:
    PVar2 = (this->stdoutChannel).type;
    if (PVar2 != Normal) {
      if (((PVar2 != Redirect) && (PVar2 != PipeSource)) || ((this->processChannelMode & 0xfe) == 2)
         ) {
        openChannelsForDetached();
      }
      if (((PVar2 | PipeSink) == Redirect) &&
         (bVar1 = openChannel(this,&this->stdoutChannel), !bVar1)) goto LAB_0041c18a;
    }
    PVar2 = (this->stderrChannel).type;
    if (PVar2 != Normal) {
      if (PVar2 == Redirect) {
        if ((this->processChannelMode < 5) &&
           ((0x16U >> (this->processChannelMode & 0x1f) & 1) != 0)) {
          local_38 = 2;
          local_34 = 0;
          uStack_2c = 0;
          local_24 = 0;
          local_20 = "default";
          QMessageLogger::warning
                    ((QMessageLogger *)&stack0xffffffffffffffc8,
                     "QProcess::openChannelsForDetached: Inconsistent stderr channel configuration")
          ;
        }
        bVar1 = openChannel(this,&this->stderrChannel);
        if (!bVar1) goto LAB_0041c18a;
      }
      else {
        openChannelsForDetached((QProcessPrivate *)&stack0xffffffffffffffc8);
      }
    }
    bVar1 = true;
  }
  else {
    PVar2 = PVar2 & ~PipeSource;
    if ((PVar2 != PipeSink) || (this->inputChannelMode == '\x01')) {
      local_38 = 2;
      local_34 = 0;
      uStack_2c = 0;
      local_24 = 0;
      local_20 = "default";
      QMessageLogger::warning
                ((QMessageLogger *)&stack0xffffffffffffffc8,
                 "QProcess::openChannelsForDetached: Inconsistent stdin channel configuration");
      if (PVar2 != PipeSink) goto LAB_0041c103;
    }
    bVar1 = openChannel(this,&this->stdinChannel);
    if (bVar1) goto LAB_0041c103;
LAB_0041c18a:
    bVar1 = false;
  }
  if (*(QObject ***)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::openChannelsForDetached()
{
    // stdin channel.
    bool needToOpen = (stdinChannel.type == Channel::Redirect
                       || stdinChannel.type == Channel::PipeSink);
    if (stdinChannel.type != Channel::Normal
            && (!needToOpen
                || inputChannelMode == QProcess::ForwardedInputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdin channel configuration");
    }
    if (needToOpen && !openChannel(stdinChannel))
        return false;

    // stdout channel.
    needToOpen = (stdoutChannel.type == Channel::Redirect
                  || stdoutChannel.type == Channel::PipeSource);
    if (stdoutChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedOutputChannel)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stdout channel configuration");
    }
    if (needToOpen && !openChannel(stdoutChannel))
        return false;

    // stderr channel.
    needToOpen = (stderrChannel.type == Channel::Redirect);
    if (stderrChannel.type != Channel::Normal
            && (!needToOpen
                || processChannelMode == QProcess::ForwardedChannels
                || processChannelMode == QProcess::ForwardedErrorChannel
                || processChannelMode == QProcess::MergedChannels)) {
        qWarning("QProcess::openChannelsForDetached: Inconsistent stderr channel configuration");
    }
    if (needToOpen && !openChannel(stderrChannel))
        return false;

    return true;
}